

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool clip_model_quantize(char *fname_inp,char *fname_out,int itype)

{
  pointer pgVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  reference pvVar8;
  iterator pbVar9;
  uchar *puVar10;
  int in_EDX;
  char *in_RSI;
  value_type vVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> meta;
  size_t j_1;
  size_t pad;
  size_t orig_size;
  size_t j;
  float *f32_data;
  size_t n_elms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool quantize;
  size_t new_size;
  void *new_data;
  ggml_type new_type;
  ggml_tensor *cur_1;
  string name_1;
  int i_2;
  size_t total_size_new;
  size_t total_size_org;
  vector<float,_std::allocator<float>_> conv_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  k_names;
  size_t i_1;
  size_t meta_size;
  ggml_tensor *cur;
  char *name;
  int i;
  int n_tensors;
  ofstream fout;
  gguf_context *ctx_out;
  pointer *ctx_data;
  pointer *ctx_src;
  clip_ctx *ctx_clip;
  ggml_type type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa68;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffa70;
  clip_ctx *pcVar16;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  size_type in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  uint in_stack_fffffffffffffa94;
  allocator_type *in_stack_fffffffffffffa98;
  char *pcVar17;
  allocator<char> *in_stack_fffffffffffffaa0;
  iterator in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffae0;
  clip_context_params in_stack_fffffffffffffae8;
  bool local_4dd;
  string *local_468;
  undefined1 local_421 [25];
  ulong local_408;
  ulong local_400;
  long local_3f8;
  int local_3ec;
  ulong local_3e8;
  float *local_3e0;
  ulong local_3d8;
  reference local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a0;
  undefined1 *local_398;
  byte local_389;
  iterator local_388;
  uchar *local_380;
  int local_374;
  int *local_370;
  allocator<char> local_361;
  string local_360 [36];
  int local_33c;
  _Alloc_hider *local_338;
  long local_330;
  vector<float,_std::allocator<float>_> local_320;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_300;
  undefined1 local_2e2;
  allocator<char> local_2e1;
  string *local_2e0;
  string local_2d8 [32];
  string *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [24];
  ulong local_290;
  ulong local_288;
  undefined8 local_280;
  undefined8 local_278;
  int local_270;
  int local_25c;
  char local_258 [512];
  clip_ctx *local_58;
  pointer local_50;
  pointer *local_48;
  pointer local_40;
  pointer *local_38;
  undefined1 local_30;
  undefined4 uStack_2c;
  clip_ctx *local_28;
  int local_20;
  int local_1c;
  char *local_18;
  byte local_1;
  
  local_30 = 0;
  uStack_2c = 4;
  local_20 = in_EDX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_28 = clip_init(in_stack_fffffffffffffae0,in_stack_fffffffffffffae8);
  local_40 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffa70)
  ;
  local_38 = &local_40;
  local_50 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                       ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_fffffffffffffa70)
  ;
  local_48 = &local_50;
  local_58 = (clip_ctx *)gguf_init_empty();
  gguf_set_kv(local_58,*local_38);
  gguf_set_val_u32(local_58,"general.quantization_version",2);
  gguf_set_val_u32(local_58,"general.file_type",local_1c);
  std::ofstream::ofstream(local_258,local_18,_S_bin);
  local_25c = gguf_get_n_tensors(*local_38);
  for (local_270 = 0; local_270 < local_25c; local_270 = local_270 + 1) {
    local_278 = gguf_get_tensor_name(*local_38,(long)local_270);
    local_280 = ggml_get_tensor(*local_48,local_278);
    gguf_add_tensor(local_58,local_280);
  }
  local_288 = gguf_get_meta_size(local_58);
  for (local_290 = 0; local_290 < local_288; local_290 = local_290 + 1) {
    std::ostream::put((char)local_258);
  }
  local_2e2 = 1;
  local_2e0 = local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  local_2e2 = 0;
  local_2b8 = local_2d8;
  local_2b0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1a6ab5);
  __l._M_len = (size_type)in_stack_fffffffffffffab0;
  __l._M_array = in_stack_fffffffffffffaa8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffaa0,__l,in_stack_fffffffffffffa98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1a6ae9);
  local_468 = (string *)&local_2b8;
  do {
    local_468 = local_468 + -0x20;
    std::__cxx11::string::~string(local_468);
  } while (local_468 != local_2d8);
  std::allocator<char>::~allocator(&local_2e1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1a6b5d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),in_stack_fffffffffffffa88
             ,(allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1a6b86);
  std::allocator<float>::allocator((allocator<float> *)0x1a6b9b);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),in_stack_fffffffffffffa88
             ,(allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<float>::~allocator((allocator<float> *)0x1a6bc4);
  local_330 = 0;
  local_338 = (_Alloc_hider *)0x0;
  for (local_33c = 0; local_33c < local_25c; local_33c = local_33c + 1) {
    gguf_get_tensor_name(*local_38,(long)local_33c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0
              );
    std::allocator<char>::~allocator(&local_361);
    pgVar1 = *local_48;
    uVar4 = std::__cxx11::string::c_str();
    local_370 = (int *)ggml_get_tensor(pgVar1,uVar4);
    local_389 = 0;
    local_398 = local_2a8;
    local_3a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffa68);
    local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(in_stack_fffffffffffffa68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa70,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffa68), bVar2) {
      local_3b0 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_3a0);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffab0,
                 in_stack_fffffffffffffaa8,(flag_type)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         (match_flag_type)((ulong)in_stack_fffffffffffffa70 >> 0x20));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (in_stack_fffffffffffffa70);
      if (bVar2) {
        local_389 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3a0);
    }
    iVar3 = ggml_n_dims(local_370);
    local_4dd = false;
    if (iVar3 == 2) {
      lVar6 = *(long *)(local_370 + 4);
      lVar5 = ggml_blck_size(local_20);
      local_4dd = lVar5 < lVar6;
    }
    local_389 = (local_389 & 1 & local_4dd) != 0;
    if ((bool)local_389) {
      local_374 = local_20;
      if ((9 < local_20) &&
         (lVar6 = std::__cxx11::string::find((char *)local_360,0x3c2769), lVar6 != -1)) {
        local_374 = 8;
      }
      local_3d8 = ggml_nelements(local_370);
      if (*local_370 == 0) {
        local_3e0 = *(float **)(local_370 + 0x3e);
LAB_001a71d7:
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_300);
        if (sVar7 < local_3d8 << 2) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa88);
        }
        local_380 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a721f);
        in_stack_fffffffffffffa68 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        local_388 = (iterator)
                    ggml_quantize_chunk(local_374,local_3e0,local_380,0,
                                        local_3d8 / *(ulong *)(local_370 + 4));
        goto LAB_001a72e7;
      }
      if (*local_370 == 1) {
        sVar7 = std::vector<float,_std::allocator<float>_>::size(&local_320);
        if (sVar7 < local_3d8) {
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa88);
        }
        for (local_3e8 = 0; local_3e8 < local_3d8; local_3e8 = local_3e8 + 1) {
          vVar11 = (value_type)
                   ggml_fp16_to_fp32(*(undefined2 *)(*(long *)(local_370 + 0x3e) + local_3e8 * 2));
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_320,local_3e8);
          *pvVar8 = vVar11;
        }
        local_3e0 = std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x1a7172);
        goto LAB_001a71d7;
      }
      if ((int)g_logger_state.verbosity_thold < 5) {
        clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: Please use an input file in f32 or f16\n",
                          "clip_model_quantize");
      }
      gguf_free(local_58);
      local_1 = 0;
      local_3ec = 1;
    }
    else {
      local_374 = *local_370;
      local_380 = *(uchar **)(local_370 + 0x3e);
      local_388 = (iterator)ggml_nbytes(local_370);
LAB_001a72e7:
      local_3f8 = ggml_nbytes(local_370);
      pcVar16 = local_58;
      local_330 = local_330 + local_3f8;
      local_338 = &local_388->_M_dataplus + (long)local_338;
      uVar4 = std::__cxx11::string::c_str();
      gguf_set_tensor_type(pcVar16,uVar4,local_374);
      pcVar16 = local_58;
      uVar4 = std::__cxx11::string::c_str();
      uVar4 = gguf_find_tensor(pcVar16,uVar4);
      pbVar9 = (iterator)gguf_get_tensor_size(pcVar16,uVar4);
      if (pbVar9 != local_388) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                   ,0xc37,"GGML_ASSERT(%s) failed",
                   "gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size"
                  );
      }
      pcVar16 = local_58;
      uVar4 = std::__cxx11::string::c_str();
      gguf_set_tensor_data(pcVar16,uVar4,local_380);
      std::ostream::write(local_258,(long)local_380);
      in_stack_fffffffffffffaa8 = local_388;
      in_stack_fffffffffffffab0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           gguf_get_alignment(local_58);
      pcVar17 = in_stack_fffffffffffffaa8[-1].field_2._M_local_buf + 0xf +
                (long)in_stack_fffffffffffffab0;
      in_stack_fffffffffffffaa0 = (allocator<char> *)gguf_get_alignment(local_58);
      local_400 = ((ulong)pcVar17 & ((ulong)(in_stack_fffffffffffffaa0 + -1) ^ 0xffffffffffffffff))
                  - (long)local_388;
      for (local_408 = 0; local_408 < local_400; local_408 = local_408 + 1) {
        std::ostream::put((char)local_258);
      }
      if ((int)g_logger_state.verbosity_thold < 3) {
        in_stack_fffffffffffffa88 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffa94 = ggml_n_dims(local_370);
        auVar12._8_4_ = (int)((ulong)local_3f8 >> 0x20);
        auVar12._0_8_ = local_3f8;
        auVar12._12_4_ = 0x45300000;
        auVar15._8_4_ = (int)((ulong)local_388 >> 0x20);
        auVar15._0_8_ = local_388;
        auVar15._12_4_ = 0x45300000;
        clip_log_internal((ggml_log_level)
                          (((auVar12._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_3f8) - 4503599627370496.0)) *
                           0.0009765625 * 0.0009765625),
                          (char *)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)local_388) - 4503599627370496.0
                                   )) * 0.0009765625 * 0.0009765625),2,
                          "%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n",
                          in_stack_fffffffffffffa88,(ulong)in_stack_fffffffffffffa94,
                          (ulong)(local_389 & 1));
      }
      local_3ec = 0;
    }
    std::__cxx11::string::~string(local_360);
    if (local_3ec != 0) goto LAB_001a7828;
  }
  std::ostream::seekp((long)local_258,_S_beg);
  in_stack_fffffffffffffa80 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_421;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1a7639);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),in_stack_fffffffffffffa88
             ,(allocator_type *)in_stack_fffffffffffffa80);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1a765f);
  pcVar16 = local_58;
  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a7679);
  gguf_get_meta_data(pcVar16,puVar10);
  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1a7695);
  std::ostream::write(local_258,(long)puVar10);
  std::ofstream::close();
  clip_free(pcVar16);
  gguf_free(local_58);
  if ((int)g_logger_state.verbosity_thold < 3) {
    auVar13._8_4_ = (int)((ulong)local_330 >> 0x20);
    auVar13._0_8_ = local_330;
    auVar13._12_4_ = 0x45300000;
    clip_log_internal((ggml_log_level)
                      (((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_330) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625),(char *)0x2,"%s: original  size = %8.2f MB\n",
                      "clip_model_quantize");
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    auVar14._8_4_ = (int)((ulong)local_338 >> 0x20);
    auVar14._0_8_ = local_338;
    auVar14._12_4_ = 0x45300000;
    clip_log_internal((ggml_log_level)
                      (((auVar14._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_338) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625),(char *)0x2,"%s: quantized size = %8.2f MB\n",
                      "clip_model_quantize");
  }
  local_1 = 1;
  local_3ec = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa80);
LAB_001a7828:
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa80);
  std::ofstream::~ofstream(local_258);
  return (bool)(local_1 & 1);
}

Assistant:

bool clip_model_quantize(const char * fname_inp, const char * fname_out, const int itype) {
    assert(itype < GGML_TYPE_COUNT);
    ggml_type type = static_cast<ggml_type>(itype);

    auto * ctx_clip = clip_init(fname_inp, clip_context_params{
        /* use_gpu */   false,
        /* verbosity */ GGML_LOG_LEVEL_ERROR,
    });

    const auto & ctx_src = ctx_clip->ctx_gguf.get();
    const auto & ctx_data = ctx_clip->ctx_data.get();

    auto * ctx_out = gguf_init_empty();
    gguf_set_kv(ctx_out, ctx_src);
    gguf_set_val_u32(ctx_out, "general.quantization_version", GGML_QNT_VERSION);
    gguf_set_val_u32(ctx_out, "general.file_type", itype);

    auto fout = std::ofstream(fname_out, std::ios::binary);

    const int n_tensors = gguf_get_n_tensors(ctx_src);

    for (int i = 0; i < n_tensors; ++i) {
        const char * name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name);
        gguf_add_tensor(ctx_out, cur);
    }

    const size_t meta_size = gguf_get_meta_size(ctx_out);
    for (size_t i = 0; i < meta_size; ++i) {
        fout.put(0);
    }

    // regexes of tensor names to be quantized
    const std::vector<std::string> k_names = {
        ".*weight",
    };

    std::vector<uint8_t> work(512);
    std::vector<float> conv_buf(512);
    size_t total_size_org = 0;
    size_t total_size_new = 0;

    for (int i = 0; i < n_tensors; ++i) {
        const std::string name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name.c_str());

        enum ggml_type new_type;
        void * new_data;
        size_t new_size;

        bool quantize = false;
        for (const auto & s : k_names) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = true;
                break;
            }
        }

        // quantize only 2D tensors and bigger than block size
        quantize &= (ggml_n_dims(cur) == 2) && cur->ne[0] > ggml_blck_size(type);

        if (quantize) {
            new_type = type;
            if (new_type >= GGML_TYPE_Q2_K && name.find("embd") != std::string::npos) {
                new_type = GGML_TYPE_Q8_0; // ggml_get_rows needs non K type
                // LOG_ERR("%s: quantizing %s to %s\n", __func__, name.c_str(), ggml_type_name(new_type));
            }
            const size_t n_elms = ggml_nelements(cur);
            float * f32_data;

            switch (cur->type) {
            case GGML_TYPE_F32:
                f32_data = (float *)cur->data;
                break;
            case GGML_TYPE_F16:
                if (conv_buf.size() < n_elms) {
                    conv_buf.resize(n_elms);
                }
                for (size_t j = 0; j < n_elms; ++j) {
                    conv_buf[j] = ggml_fp16_to_fp32(((ggml_fp16_t *)cur->data)[j]);
                }
                f32_data = (float *)conv_buf.data();
                break;
            default:
                LOG_ERR("%s: Please use an input file in f32 or f16\n", __func__);
                gguf_free(ctx_out);
                return false;
            }

            if (work.size() < n_elms * 4) {
                work.resize(n_elms * 4);
            }
            new_data = work.data();

            new_size = ggml_quantize_chunk(new_type, f32_data, new_data, 0, n_elms/cur->ne[0], cur->ne[0], nullptr);
        } else {
            new_type = cur->type;
            new_data = cur->data;
            new_size = ggml_nbytes(cur);
        }
        const size_t orig_size = ggml_nbytes(cur);
        total_size_org += orig_size;
        total_size_new += new_size;
        gguf_set_tensor_type(ctx_out, name.c_str(), new_type);
        GGML_ASSERT(gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size);
        gguf_set_tensor_data(ctx_out, name.c_str(), new_data);
        fout.write((const char *)new_data, new_size);
        size_t pad = GGML_PAD(new_size, gguf_get_alignment(ctx_out)) - new_size;
        for (size_t j = 0; j < pad; ++j) {
            fout.put(0);
        }

        LOG_INF("%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n", name.c_str(), ggml_n_dims(cur), quantize,
               orig_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
    }

    // go back to beginning of file and write the updated metadata
    fout.seekp(0, std::ios::beg);
    std::vector<uint8_t> meta(meta_size);
    gguf_get_meta_data(ctx_out, meta.data());
    fout.write((const char *)meta.data(), meta_size);

    fout.close();

    clip_free(ctx_clip);
    gguf_free(ctx_out);

    {
        LOG_INF("%s: original  size = %8.2f MB\n", __func__, total_size_org / 1024.0 / 1024.0);
        LOG_INF("%s: quantized size = %8.2f MB\n", __func__, total_size_new / 1024.0 / 1024.0);
    }

    return true;
}